

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_instance.cpp
# Opt level: O2

void __thiscall LoaderInstance::~LoaderInstance(LoaderInstance *this)

{
  ostringstream oss;
  LoaderInstance *in_stack_fffffffffffffe18;
  allocator local_1d9;
  string local_1d8;
  string local_1b8;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_198;
  ostringstream local_180 [376];
  
  this->_vptr_LoaderInstance = (_func_int **)&PTR__LoaderInstance_001499e8;
  std::__cxx11::ostringstream::ostringstream(local_180);
  std::operator<<((ostream *)local_180,"Destroying LoaderInstance = ");
  PointerToHexString<LoaderInstance>(in_stack_fffffffffffffe18);
  std::operator<<((ostream *)local_180,(string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::string((string *)&local_1d8,"xrDestroyInstance",&local_1d9);
  std::__cxx11::stringbuf::str();
  local_198.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LoaderLogger::LogInfoMessage(&local_1d8,&local_1b8,&local_198);
  std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  std::unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
  ::~unique_ptr(&this->_dispatch_table);
  std::
  vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
  ::~vector(&this->_api_layer_interfaces);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->_enabled_extensions);
  return;
}

Assistant:

LoaderInstance::~LoaderInstance() {
    std::ostringstream oss;
    oss << "Destroying LoaderInstance = ";
    oss << PointerToHexString(this);
    LoaderLogger::LogInfoMessage("xrDestroyInstance", oss.str());
}